

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ButtonTests.cpp
# Opt level: O0

void __thiscall
solitaire::ButtonTests_collidesWith_Test::TestBody(ButtonTests_collidesWith_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  string local_210;
  AssertHelper local_1f0;
  Message local_1e8;
  bool local_1d9;
  undefined1 local_1d8 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_1a8;
  Message local_1a0;
  bool local_191;
  undefined1 local_190 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_160;
  Message local_158;
  Position local_14c;
  Position local_144;
  bool local_139;
  undefined1 local_138 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_108;
  Message local_100;
  Position local_f4;
  Position local_ec;
  bool local_e1;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_b0;
  Message local_a8;
  Position local_9c;
  Position local_94;
  bool local_89;
  undefined1 local_88 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_58;
  Message local_50 [3];
  Position local_34;
  Position local_2c;
  bool local_21;
  undefined1 local_20 [8];
  AssertionResult gtest_ar_;
  ButtonTests_collidesWith_Test *this_local;
  
  local_34.x = 1;
  local_34.y = 0;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  local_2c = geometry::operator-((Position *)&(anonymous_namespace)::position,&local_34);
  local_21 = Button::collidesWith(&(this->super_ButtonTests).button,&local_2c);
  local_21 = !local_21;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_20,&local_21,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_20,
               (AssertionResult *)"button.collidesWith(position - Position {1, 0})","true","false",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/ButtonTests.cpp"
               ,0x23,pcVar2);
    testing::internal::AssertHelper::operator=(&local_58,local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(local_50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  local_9c.x = 0;
  local_9c.y = 1;
  local_94 = geometry::operator-((Position *)&(anonymous_namespace)::position,&local_9c);
  local_89 = Button::collidesWith(&(this->super_ButtonTests).button,&local_94);
  local_89 = !local_89;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_88,&local_89,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
  if (!bVar1) {
    testing::Message::Message(&local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_88,
               (AssertionResult *)"button.collidesWith(position - Position {0, 1})","true","false",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/ButtonTests.cpp"
               ,0x24,pcVar2);
    testing::internal::AssertHelper::operator=(&local_b0,&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
  local_f4.x = 1;
  local_f4.y = 0;
  local_ec = geometry::operator+((Position *)&(anonymous_namespace)::bottomLeftCorner,&local_f4);
  local_e1 = Button::collidesWith(&(this->super_ButtonTests).button,&local_ec);
  local_e1 = !local_e1;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_e0,&local_e1,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
  if (!bVar1) {
    testing::Message::Message(&local_100);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_e0,
               (AssertionResult *)"button.collidesWith(bottomLeftCorner + Position {1, 0})","true",
               "false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/ButtonTests.cpp"
               ,0x25,pcVar2);
    testing::internal::AssertHelper::operator=(&local_108,&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_100);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
  local_14c.x = 0;
  local_14c.y = 1;
  local_144 = geometry::operator+((Position *)&(anonymous_namespace)::bottomLeftCorner,&local_14c);
  local_139 = Button::collidesWith(&(this->super_ButtonTests).button,&local_144);
  local_139 = !local_139;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_138,&local_139,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
  if (!bVar1) {
    testing::Message::Message(&local_158);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4.message_,(internal *)local_138,
               (AssertionResult *)"button.collidesWith(bottomLeftCorner + Position {0, 1})","true",
               "false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/ButtonTests.cpp"
               ,0x26,pcVar2);
    testing::internal::AssertHelper::operator=(&local_160,&local_158);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_158);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_138);
  local_191 = Button::collidesWith
                        (&(this->super_ButtonTests).button,
                         (Position *)&(anonymous_namespace)::position);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_190,&local_191,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_190);
  if (!bVar1) {
    testing::Message::Message(&local_1a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__5.message_,(internal *)local_190,
               (AssertionResult *)"button.collidesWith(position)","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/ButtonTests.cpp"
               ,0x27,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1a8,&local_1a0);
    testing::internal::AssertHelper::~AssertHelper(&local_1a8);
    std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
    testing::Message::~Message(&local_1a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_190);
  local_1d9 = Button::collidesWith
                        (&(this->super_ButtonTests).button,
                         (Position *)&(anonymous_namespace)::bottomLeftCorner);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1d8,&local_1d9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d8);
  if (!bVar1) {
    testing::Message::Message(&local_1e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_210,(internal *)local_1d8,
               (AssertionResult *)"button.collidesWith(bottomLeftCorner)","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/ButtonTests.cpp"
               ,0x28,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1f0,&local_1e8);
    testing::internal::AssertHelper::~AssertHelper(&local_1f0);
    std::__cxx11::string::~string((string *)&local_210);
    testing::Message::~Message(&local_1e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d8);
  return;
}

Assistant:

TEST_F(ButtonTests, collidesWith) {
    EXPECT_FALSE(button.collidesWith(position - Position {1, 0}));
    EXPECT_FALSE(button.collidesWith(position - Position {0, 1}));
    EXPECT_FALSE(button.collidesWith(bottomLeftCorner + Position {1, 0}));
    EXPECT_FALSE(button.collidesWith(bottomLeftCorner + Position {0, 1}));
    EXPECT_TRUE(button.collidesWith(position));
    EXPECT_TRUE(button.collidesWith(bottomLeftCorner));
}